

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf.h
# Opt level: O2

vec3 * __thiscall cosine_pdf::generate(vec3 *__return_storage_ptr__,cosine_pdf *this)

{
  vec3 local_30;
  
  random_cosine_direction();
  onb::transform(&this->uvw,&local_30);
  return __return_storage_ptr__;
}

Assistant:

vec3 generate() const override {
        return uvw.transform(random_cosine_direction());
    }